

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise.cpp
# Opt level: O1

Float pbrt::FBm(Point3f p,Vector3f dpdx,Vector3f dpdy,Float omega,int maxOctaves)

{
  undefined1 auVar1 [16];
  undefined8 uVar2;
  float fVar3;
  int iVar4;
  int iVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  float fVar8;
  undefined8 in_XMM0_Qb;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [16];
  float in_XMM2_Dd;
  float in_XMM4_Dd;
  undefined1 auVar17 [64];
  float fVar18;
  undefined1 in_register_000013c4 [12];
  undefined4 local_58;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  
  auVar17._4_60_ = dpdy._12_60_;
  auVar17._0_4_ = dpdy.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar13._4_60_ = dpdx._12_60_;
  auVar13._0_4_ = dpdx.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar9._0_4_ = dpdx.super_Tuple3<pbrt::Vector3,_float>.x *
                 dpdx.super_Tuple3<pbrt::Vector3,_float>.x;
  auVar9._4_4_ = dpdx.super_Tuple3<pbrt::Vector3,_float>.y *
                 dpdx.super_Tuple3<pbrt::Vector3,_float>.y;
  auVar9._8_4_ = 0;
  auVar9._12_4_ = in_XMM2_Dd * in_XMM2_Dd;
  auVar16._0_4_ =
       dpdy.super_Tuple3<pbrt::Vector3,_float>.x * dpdy.super_Tuple3<pbrt::Vector3,_float>.x;
  auVar16._4_4_ =
       dpdy.super_Tuple3<pbrt::Vector3,_float>.y * dpdy.super_Tuple3<pbrt::Vector3,_float>.y;
  auVar16._8_4_ = 0;
  auVar16._12_4_ = in_XMM4_Dd * in_XMM4_Dd;
  auVar6 = vhaddps_avx(auVar9,auVar16);
  auVar9 = vinsertps_avx(auVar13._0_16_,auVar17._0_16_,0x10);
  auVar6 = vshufps_avx(auVar6,auVar6,0xe8);
  auVar10._0_4_ = auVar9._0_4_ * auVar9._0_4_ + auVar6._0_4_;
  auVar10._4_4_ = auVar9._4_4_ * auVar9._4_4_ + auVar6._4_4_;
  auVar10._8_4_ = auVar9._8_4_ * auVar9._8_4_ + auVar6._8_4_;
  auVar10._12_4_ = auVar9._12_4_ * auVar9._12_4_ + auVar6._12_4_;
  auVar6 = vmovshdup_avx(auVar10);
  auVar6 = vmaxss_avx(auVar6,auVar10);
  fVar8 = logf(auVar6._0_4_);
  auVar1._8_8_ = in_XMM0_Qb;
  auVar1._0_8_ = p.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar9 = vfmadd213ss_fma(SUB6416(ZEXT464(0xbf000000),0),ZEXT416((uint)(fVar8 * 1.442695)),
                           ZEXT416(0xbf800000));
  auVar11._0_4_ = (float)maxOctaves;
  auVar11._4_12_ = in_register_000013c4;
  auVar6 = vminss_avx(auVar11,auVar9);
  uVar2 = vcmpss_avx512f(auVar9,ZEXT816(0),1);
  fVar3 = (float)((uint)!(bool)((byte)uVar2 & 1) * auVar6._0_4_);
  auVar6._0_4_ = fVar3;
  auVar6 = vroundss_avx(auVar6,auVar6,9);
  iVar4 = (int)auVar6._0_4_;
  fVar18 = 1.0;
  fVar8 = 1.0;
  auVar6 = vmovshdup_avx(auVar1);
  auVar13 = ZEXT864(0) << 0x20;
  auVar9 = auVar13._0_16_;
  if (0 < iVar4) {
    fVar18 = 1.0;
    iVar5 = iVar4;
    fVar8 = fVar18;
    do {
      auVar14._0_4_ =
           Noise(p.super_Tuple3<pbrt::Point3,_float>.x * fVar8,auVar6._0_4_ * fVar8,
                 fVar8 * p.super_Tuple3<pbrt::Point3,_float>.z);
      auVar14._4_60_ = extraout_var;
      auVar9 = vfmadd231ss_fma(auVar13._0_16_,ZEXT416((uint)fVar18),auVar14._0_16_);
      auVar13 = ZEXT1664(auVar9);
      fVar8 = fVar8 * 1.99;
      fVar18 = fVar18 * omega;
      iVar5 = iVar5 + -1;
    } while (iVar5 != 0);
  }
  auVar12._0_4_ = ((fVar3 - (float)iVar4) + -0.3) / 0.39999998;
  auVar12._4_12_ = SUB6012((undefined1  [60])0x0,0);
  auVar1 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar12);
  uVar2 = vcmpss_avx512f(auVar12,ZEXT816(0) << 0x40,1);
  fVar3 = (float)((uint)!(bool)((byte)uVar2 & 1) * auVar1._0_4_);
  auVar7._4_12_ = auVar1._4_12_;
  auVar7._0_4_ = fVar3;
  auVar1 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar7,ZEXT416(0x40400000));
  auVar15._0_4_ =
       Noise(p.super_Tuple3<pbrt::Point3,_float>.x * fVar8,auVar6._0_4_ * fVar8,
             fVar8 * p.super_Tuple3<pbrt::Point3,_float>.z);
  auVar15._4_60_ = extraout_var_00;
  local_58 = auVar9._0_4_;
  auVar6 = vfmadd213ss_fma(auVar15._0_16_,ZEXT416((uint)(fVar3 * fVar3 * auVar1._0_4_ * fVar18)),
                           ZEXT416(local_58));
  return auVar6._0_4_;
}

Assistant:

Float FBm(Point3f p, Vector3f dpdx, Vector3f dpdy, Float omega, int maxOctaves) {
    // Compute number of octaves for antialiased FBm
    Float len2 = std::max(LengthSquared(dpdx), LengthSquared(dpdy));
    Float n = Clamp(-1 - .5f * Log2(len2), 0, maxOctaves);
    int nInt = std::floor(n);

    // Compute sum of octaves of noise for FBm
    Float sum = 0, lambda = 1, o = 1;
    for (int i = 0; i < nInt; ++i) {
        sum += o * Noise(lambda * p);
        lambda *= 1.99f;
        o *= omega;
    }
    Float nPartial = n - nInt;
    sum += o * SmoothStep(nPartial, .3f, .7f) * Noise(lambda * p);

    return sum;
}